

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix.cpp
# Opt level: O2

vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
* __thiscall
Matrix::RandomNumbersInMatrix
          (vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           *__return_storage_ptr__,Matrix *this,
          vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
          *matrixVec)

{
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  *pvVar1;
  int iVar2;
  time_t tVar3;
  int iVar4;
  long lVar5;
  bool bVar6;
  int randomNumber;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  *local_50;
  _Vector_base<int,_std::allocator<int>_> local_48;
  
  local_50 = __return_storage_ptr__;
  tVar3 = time((time_t *)0x0);
  srand((uint)tVar3);
  for (lVar5 = 0; pvVar1 = local_50, lVar5 != 3; lVar5 = lVar5 + 1) {
    local_48._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_48._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_48._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::
    vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>
    ::emplace_back<std::vector<int,std::allocator<int>>>
              ((vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>
                *)matrixVec,(vector<int,_std::allocator<int>_> *)&local_48);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_48);
    iVar4 = 5;
    while (bVar6 = iVar4 != 0, iVar4 = iVar4 + -1, bVar6) {
      iVar2 = rand();
      randomNumber = iVar2 % 5 + 1;
      std::vector<int,_std::allocator<int>_>::push_back
                ((matrixVec->
                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start + lVar5,&randomNumber);
    }
  }
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector(local_50,matrixVec);
  return pvVar1;
}

Assistant:

std::vector<std::vector<int>> Matrix::RandomNumbersInMatrix(std::vector<std::vector<int>>& matrixVec) {
	srand(time(0));
	int randomNumber;
	int const numberOfFigures = 5;
	for (int i = 0; i < _rows; ++i) {
		matrixVec.push_back(std::vector<int>());

		for (int j = 0; j < _columns; ++j) {
			randomNumber = rand() % numberOfFigures + 1;
			matrixVec[i].push_back(randomNumber);
		}
	}

	return matrixVec;
}